

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall vkb::SystemInfo::is_extension_available(SystemInfo *this,char *extension_name)

{
  bool bVar1;
  
  if (extension_name != (char *)0x0) {
    bVar1 = detail::check_extension_supported(&this->available_extensions,extension_name);
    return bVar1;
  }
  return false;
}

Assistant:

bool SystemInfo::is_extension_available(const char* extension_name) const {
    if (!extension_name) return false;
    return detail::check_extension_supported(available_extensions, extension_name);
}